

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariable.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::StandardVariable::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,StandardVariable *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  StandardVariable *local_18;
  StandardVariable *this_local;
  
  local_18 = this;
  this_local = (StandardVariable *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Standard Variable:");
  poVar1 = std::operator<<(poVar1,"\n\tType:    ");
  ENUMS::GetEnumAsStringStandardVariableType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui32Type,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tLength:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Length);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString StandardVariable::GetAsString() const
{
    KStringStream ss;

    ss << "Standard Variable:"
       << "\n\tType:    " << GetEnumAsStringStandardVariableType( m_ui32Type )
       << "\n\tLength:  " << m_ui16Length
       << "\n";

    return ss.str();
}